

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeDataDrop(TranslateToFuzzReader *this)

{
  __uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true> _Var1;
  undefined8 uVar2;
  uintptr_t uVar3;
  uint32_t uVar4;
  Expression *pEVar5;
  
  if (this->allowMemory != false) {
    uVar4 = Random::upTo(&this->random,
                         (uint32_t)
                         ((ulong)((long)(this->wasm->dataSegments).
                                        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->wasm->dataSegments).
                                       super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3));
    _Var1.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
    super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
         (this->wasm->dataSegments).
         super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>;
    uVar2 = *(undefined8 *)
             _Var1.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    uVar3 = *(uintptr_t *)
             ((long)_Var1.
                    super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                    .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 8);
    pEVar5 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
    *(undefined8 *)pEVar5 = 0;
    (pEVar5->type).id = 0;
    *(undefined8 *)(pEVar5 + 1) = 0;
    pEVar5[1].type.id = 0;
    pEVar5->_id = DataDropId;
    (pEVar5->type).id = 0;
    *(undefined8 *)(pEVar5 + 1) = 0;
    *(undefined8 *)(pEVar5 + 1) = uVar2;
    pEVar5[1].type.id = uVar3;
    ::wasm::DataDrop::finalize();
    return pEVar5;
  }
  pEVar5 = makeTrivial(this,(Type)0x0);
  return pEVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeDataDrop() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Index segIdx = upTo(wasm.dataSegments.size());
  Name segment = wasm.dataSegments[segIdx]->name;
  return builder.makeDataDrop(segment);
}